

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sighashtype.cpp
# Opt level: O0

void __thiscall SigHashType_CheckFlag_Test::TestBody(SigHashType_CheckFlag_Test *this)

{
  SigHashType *pSVar1;
  SigHashType *this_00;
  bool bVar2;
  char *pcVar3;
  char *in_R9;
  string local_1a8;
  AssertHelper local_188;
  Message local_180;
  bool local_171;
  undefined1 local_170 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_140;
  Message local_138;
  bool local_129;
  undefined1 local_128 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_f8;
  Message local_f0;
  bool local_e1;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_b0;
  Message local_a8;
  bool local_99;
  undefined1 local_98 [8];
  AssertionResult gtest_ar__1;
  string local_78;
  AssertHelper local_58;
  Message local_50 [3];
  bool local_31;
  undefined1 local_30 [8];
  AssertionResult gtest_ar_;
  SigHashType sighash;
  SigHashType_CheckFlag_Test *this_local;
  
  pSVar1 = (SigHashType *)((long)&gtest_ar_.message_.ptr_ + 4);
  cfd::core::SigHashType::SigHashType(pSVar1,kSigHashUnknown,false,false);
  local_31 = cfd::core::SigHashType::IsValid(pSVar1);
  local_31 = !local_31;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_30,&local_31,(type *)0x0)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar2) {
    testing::Message::Message(local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_78,(internal *)local_30,(AssertionResult *)"sighash.IsValid()","true","false",
               in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_sighashtype.cpp"
               ,0x30,pcVar3);
    testing::internal::AssertHelper::operator=(&local_58,local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    testing::Message::~Message(local_50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  pSVar1 = (SigHashType *)((long)&gtest_ar__1.message_.ptr_ + 4);
  cfd::core::SigHashType::SigHashType(pSVar1,kSigHashAll,false,false);
  this_00 = (SigHashType *)((long)&gtest_ar_.message_.ptr_ + 4);
  cfd::core::SigHashType::operator=(this_00,pSVar1);
  cfd::core::SigHashType::SetRangeproof(this_00,true);
  local_99 = cfd::core::SigHashType::IsAnyoneCanPay(this_00);
  local_99 = !local_99;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_98,&local_99,(type *)0x0)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar2) {
    testing::Message::Message(&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_98,
               (AssertionResult *)"sighash.IsAnyoneCanPay()","true","false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_sighashtype.cpp"
               ,0x34,pcVar3);
    testing::internal::AssertHelper::operator=(&local_b0,&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  local_e1 = cfd::core::SigHashType::IsRangeproof
                       ((SigHashType *)((long)&gtest_ar_.message_.ptr_ + 4));
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_e0,&local_e1,(type *)0x0)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
  if (!bVar2) {
    testing::Message::Message(&local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_e0,
               (AssertionResult *)"sighash.IsRangeproof()","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_sighashtype.cpp"
               ,0x35,pcVar3);
    testing::internal::AssertHelper::operator=(&local_f8,&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
  pSVar1 = (SigHashType *)((long)&gtest_ar_.message_.ptr_ + 4);
  cfd::core::SigHashType::SetAnyoneCanPay(pSVar1,true);
  local_129 = cfd::core::SigHashType::IsAnyoneCanPay(pSVar1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_128,&local_129,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
  if (!bVar2) {
    testing::Message::Message(&local_138);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_128,
               (AssertionResult *)"sighash.IsAnyoneCanPay()","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_sighashtype.cpp"
               ,0x37,pcVar3);
    testing::internal::AssertHelper::operator=(&local_140,&local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_138);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
  local_171 = cfd::core::SigHashType::IsRangeproof
                        ((SigHashType *)((long)&gtest_ar_.message_.ptr_ + 4));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_170,&local_171,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
  if (!bVar2) {
    testing::Message::Message(&local_180);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1a8,(internal *)local_170,(AssertionResult *)"sighash.IsRangeproof()","false",
               "true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_sighashtype.cpp"
               ,0x38,pcVar3);
    testing::internal::AssertHelper::operator=(&local_188,&local_180);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    std::__cxx11::string::~string((string *)&local_1a8);
    testing::Message::~Message(&local_180);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
  return;
}

Assistant:

TEST(SigHashType, CheckFlag) {
  SigHashType sighash = SigHashType(SigHashAlgorithm::kSigHashUnknown);
  EXPECT_FALSE(sighash.IsValid());

  sighash = SigHashType(SigHashAlgorithm::kSigHashAll);
  sighash.SetRangeproof(true);
  EXPECT_FALSE(sighash.IsAnyoneCanPay());
  EXPECT_TRUE(sighash.IsRangeproof());
  sighash.SetAnyoneCanPay(true);
  EXPECT_TRUE(sighash.IsAnyoneCanPay());
  EXPECT_TRUE(sighash.IsRangeproof());
}